

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O3

void __thiscall FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum)

{
  uint uVar1;
  DThinker *pDVar2;
  
  uVar1 = 0x20;
  if ((uint)statnum < 0x80) {
    uVar1 = statnum;
  }
  this->m_Stat = (BYTE)uVar1;
  this->m_SearchStats = 0x7f < (uint)statnum;
  this->m_ParentType = type;
  pDVar2 = FThinkerList::GetHead(DThinker::Thinkers + (uVar1 & 0xff));
  this->m_CurrThinker = pDVar2;
  this->m_SearchingFresh = false;
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	m_CurrThinker = DThinker::Thinkers[m_Stat].GetHead();
	m_SearchingFresh = false;
}